

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::build_interval
          (CRegexParser *this,re_machine *new_machine,re_machine *sub,int min_val,int max_val,
          int var_id,int shortest)

{
  wchar_t in_ECX;
  re_state_id *in_RDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  re_state_id in_R8D;
  re_state_id in_R9D;
  int in_stack_00000008;
  re_machine inner_machine;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  init_machine((CRegexParser *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (re_machine *)in_RDI);
  init_machine((CRegexParser *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (re_machine *)in_RDI);
  if (in_stack_00000008 == 0) {
    set_trans(in_RDI,in_stack_ffffffffffffffd4,*in_RDX,RE_LOOP_BRANCH,L'\0');
    set_trans(in_RDI,in_stack_ffffffffffffffd4,in_RSI[1],RE_LOOP_BRANCH,L'\0');
  }
  else {
    set_trans(in_RDI,in_stack_ffffffffffffffd4,in_RSI[1],RE_LOOP_BRANCH,L'\0');
    set_trans(in_RDI,in_stack_ffffffffffffffd4,*in_RDX,RE_LOOP_BRANCH,L'\0');
  }
  set_trans(in_RDI,in_RDX[1],in_stack_ffffffffffffffd4,RE_EPSILON,L'\0');
  set_trans(in_RDI,*in_RSI,in_stack_ffffffffffffffd4,RE_ZERO_VAR,L'\0');
  in_RDI->tuple_arr_[*in_RSI].info.str.src = in_R9D;
  in_RDI->tuple_arr_[in_stack_ffffffffffffffd4].info.str.src = in_R9D;
  in_RDI->tuple_arr_[in_stack_ffffffffffffffd4].info.ch = in_ECX;
  in_RDI->tuple_arr_[in_stack_ffffffffffffffd4].info.sub.final = in_R8D;
  if (in_stack_00000008 != 0) {
    in_RDI->tuple_arr_[in_stack_ffffffffffffffd4].flags =
         in_RDI->tuple_arr_[in_stack_ffffffffffffffd4].flags | 0x10;
  }
  return;
}

Assistant:

void CRegexParser::build_interval(re_machine *new_machine,
                                  re_machine *sub, int min_val, int max_val,
                                  int var_id, int shortest)
{
    re_machine inner_machine;
    
    /* initialize the outer (new) machine */
    init_machine(new_machine);

    /* initialize the inner machine */
    init_machine(&inner_machine);

    /* 
     *   Set the loop transition into the submachine, and set the other to
     *   bypass the submachine.  If we have a 'shortest' modifier, take
     *   the bypass branch first, otherwise take the enter branch first. 
     */
    if (shortest)
    {
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
    }
    else
    {
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
    }

    /* 
     *   set the final transition of the submachine to come back to the
     *   loop branch point 
     */
    set_trans(sub->final, inner_machine.init, RE_EPSILON, 0);

    /* 
     *   set the outer machine to transition into the inner machine and
     *   zero the loop variable 
     */
    set_trans(new_machine->init, inner_machine.init, RE_ZERO_VAR, 0);

    /* set the variable ID in the ZERO_VAR node */
    tuple_arr_[new_machine->init].info.loop.loop_var = var_id;

    /* set up the loop parameters in the loop node */
    tuple_arr_[inner_machine.init].info.loop.loop_var = var_id;
    tuple_arr_[inner_machine.init].info.loop.loop_min = min_val;
    tuple_arr_[inner_machine.init].info.loop.loop_max = max_val;

    /* 
     *   if there's a 'shortest' modifier, note it in the loop node, so
     *   that we can take the bypass branch first whenever possible 
     */
    if (shortest)
        tuple_arr_[inner_machine.init].flags |= RE_STATE_SHORTEST;
}